

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::MessageDifferencer::ShouldCompareNoPresence
          (MessageDifferencer *this,Message *message1,Reflection *reflection1,
          FieldDescriptor *field2)

{
  bool bVar1;
  Id local_28;
  
  if (((this->force_compare_no_presence_ == true) &&
      (bVar1 = FieldDescriptor::has_presence(field2), !bVar1)) &&
     (bVar1 = FieldDescriptor::is_repeated(field2), !bVar1)) {
    return true;
  }
  bVar1 = FieldDescriptor::is_repeated(field2);
  if (((!bVar1) && (bVar1 = FieldDescriptor::has_presence(field2), !bVar1)) &&
     (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field2->type_ * 4) - 1U < 9)) {
    local_28 = TextFormat::Parser::UnsetFieldsMetadata::GetUnsetFieldId(message1,field2);
    bVar1 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
            ::
            contains<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                      ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                        *)&this->require_no_presence_fields_,&local_28);
    return bVar1;
  }
  return false;
}

Assistant:

bool MessageDifferencer::ShouldCompareNoPresence(
    const Message& message1, const Reflection& reflection1,
    const FieldDescriptor* field2) const {
  const bool compare_no_presence_by_field = force_compare_no_presence_ &&
                                            !field2->has_presence() &&
                                            !field2->is_repeated();
  if (compare_no_presence_by_field) {
    return true;
  }
  const bool compare_no_presence_by_address =
      !field2->is_repeated() && !field2->has_presence() &&
      ValidMissingField(*field2) &&
      require_no_presence_fields_.ids_.contains(
          TextFormat::Parser::UnsetFieldsMetadata::GetUnsetFieldId(message1,
                                                                   *field2));
  return compare_no_presence_by_address;
}